

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.cpp
# Opt level: O0

void __thiscall jessilib::impl::timer_manager::loop(timer_manager *this)

{
  bool bVar1;
  cv_status cVar2;
  reference pptVar3;
  time_point_t tVar4;
  byte local_e5;
  weak_ptr<jessilib::impl::timer_context> local_c8;
  task_t local_b8;
  undefined1 local_98 [8];
  weak_ptr<jessilib::impl::timer_context> weak_context;
  timer_context *local_68;
  timer_context *context;
  _Self local_58;
  _Self local_50 [3];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  _Self local_30;
  _Self local_28;
  iterator itr;
  unique_lock<std::mutex> lock;
  timer_manager *this_local;
  
  do {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_thread_active);
    if (!bVar1) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&itr,&this->m_mutex);
    local_28._M_node =
         (_Base_ptr)
         std::
         multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
         ::begin(&this->m_active_timers);
    local_30._M_node =
         (_Base_ptr)
         std::
         multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
         ::end(&this->m_active_timers);
    bVar1 = std::operator==(&local_28,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::condition_variable::wait((unique_lock *)&this->m_cvar);
LAB_0021e87b:
      context._4_4_ = 0;
    }
    else {
      pptVar3 = std::_Rb_tree_const_iterator<jessilib::impl::timer_context_*>::operator*(&local_28);
      local_38.__d.__r = (duration)timer_context::next(*pptVar3);
      cVar2 = std::condition_variable::
              wait_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&this->m_cvar,(unique_lock<std::mutex> *)&itr,&local_38);
      local_e5 = 0;
      if (cVar2 == timeout) {
        bVar1 = std::
                multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
                ::empty(&this->m_active_timers);
        local_e5 = 0;
        if (!bVar1) {
          local_50[0]._M_node =
               (_Base_ptr)
               std::
               multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
               ::begin(&this->m_active_timers);
          bVar1 = std::operator==(&local_28,local_50);
          local_e5 = 0;
          if (bVar1) {
            local_58._M_node =
                 (_Base_ptr)
                 std::
                 multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
                 ::end(&this->m_active_timers);
            bVar1 = std::operator==(&local_28,&local_58);
            local_e5 = bVar1 ^ 0xff;
          }
        }
      }
      if ((local_e5 & 1) == 0) goto LAB_0021e87b;
      if ((this->is_timeout & 1U) != 0) {
        pptVar3 = std::_Rb_tree_const_iterator<jessilib::impl::timer_context_*>::operator*
                            (&local_28);
        local_68 = *pptVar3;
        std::
        multiset<jessilib::impl::timer_context*,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
        ::erase_abi_cxx11_((multiset<jessilib::impl::timer_context*,jessilib::impl::timer_manager::timer_sort,std::allocator<jessilib::impl::timer_context*>>
                            *)&this->m_active_timers,(const_iterator)local_28._M_node);
        tVar4 = timer_context::calc_next(local_68);
        (local_68->m_next).__d.__r = (rep)tVar4.__d.__r;
        weak_context.super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
             ::insert(&this->m_active_timers,&local_68);
        std::enable_shared_from_this<jessilib::impl::timer_context>::weak_from_this
                  ((enable_shared_from_this<jessilib::impl::timer_context> *)local_98);
        std::weak_ptr<jessilib::impl::timer_context>::weak_ptr
                  (&local_c8,(weak_ptr<jessilib::impl::timer_context> *)local_98);
        std::function<void()>::function<jessilib::impl::timer_manager::loop()::__0,void>
                  ((function<void()> *)&local_b8,(anon_class_16_1_c00fe1e6 *)&local_c8);
        thread_pool::push(&this->m_pool,&local_b8);
        std::function<void_()>::~function(&local_b8);
        loop()::$_0::~__0((__0 *)&local_c8);
        std::weak_ptr<jessilib::impl::timer_context>::~weak_ptr
                  ((weak_ptr<jessilib::impl::timer_context> *)local_98);
        goto LAB_0021e87b;
      }
      this->is_timeout = true;
      context._4_4_ = 2;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&itr);
  } while( true );
}

Assistant:

void timer_manager::loop() {
	// loop
	while (m_thread_active) {
		std::unique_lock<std::mutex> lock(m_mutex);
		auto itr{ m_active_timers.begin() };
		if (itr != m_active_timers.end()) {
			// Wait until the next timer is ready to fire
			if (m_cvar.wait_until(lock, (*itr)->next()) == std::cv_status::timeout
				&& !m_active_timers.empty() && itr == m_active_timers.begin() && itr != m_active_timers.end()) {

				// Due to a race condition, we may still receive timeout when another thread has notified m_cvar too late
				// Notifying the thread before releasing the lock does not resolve this, because wait_until's return
				// status may be based entirely on the time of return and the input time (as is the case in GCC 7.2)
				if (!is_timeout) {
					// itr may be invalidated; restart wait
					is_timeout = true;
					continue;
				}

				timer_context* context = *itr;

				// Reset timings
				m_active_timers.erase(itr);
				context->m_next = context->calc_next();
				m_active_timers.insert(context);

				// Push timer to execute
				std::weak_ptr<timer_context> weak_context = context->weak_from_this();
				m_pool.push([weak_context]() {
					if (auto context = weak_context.lock()) {
						// Execute timer
						// Locking will only fail when the timer is in the process of being cancelled
						std::shared_lock<std::shared_mutex> context_guard{ context->m_mutex, std::try_to_lock };
						if (context_guard.owns_lock() && !context->null()) {
							timer& callback_timer{thread_callback_timer()};
							callback_timer.m_context = context;

							// Call callback
							context->m_callback(callback_timer);

							// Release timer context
							callback_timer.m_context = nullptr;
						}
					}
				});
			}
			// else // m_active_timers changed; itr may be invalid; itr may not be the next timer
		}
		else {
			// Wait until a timer is added
			m_cvar.wait(lock);
		}
	}
}